

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

int __thiscall
chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>_>::clone
          (Data_Impl<std::shared_ptr<chaiscript::Type_Info>_> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  element_type *in_RAX;
  element_type *local_18;
  
  local_18 = in_RAX;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::Type_Info>>,std::shared_ptr<chaiscript::Type_Info>const&>
            ((shared_ptr<chaiscript::Type_Info> *)&local_18);
  (this->super_Data)._vptr_Data = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Data> clone() const override { return std::make_unique<Data_Impl<T>>(m_data); }